

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::NewLine(void)

{
  ImGuiContext *pIVar1;
  ImGuiWindow *pIVar2;
  ImVec2 *unaff_retaddr;
  ImGuiLayoutType backup_layout_type;
  ImGuiContext *g;
  ImGuiWindow *window;
  ImVec2 local_24;
  ImVec2 local_1c;
  ImGuiLayoutType local_14;
  ImGuiContext *local_10;
  
  pIVar2 = GetCurrentWindow();
  pIVar1 = GImGui;
  if ((pIVar2->SkipItems & 1U) == 0) {
    local_10 = GImGui;
    local_14 = (pIVar2->DC).LayoutType;
    (pIVar2->DC).LayoutType = 1;
    if ((pIVar2->DC).CurrentLineSize.y <= 0.0) {
      ImVec2::ImVec2(&local_24,0.0,pIVar1->FontSize);
      ItemSize(unaff_retaddr,(float)((ulong)pIVar2 >> 0x20));
    }
    else {
      ImVec2::ImVec2(&local_1c,0.0,0.0);
      ItemSize(unaff_retaddr,(float)((ulong)pIVar2 >> 0x20));
    }
    (pIVar2->DC).LayoutType = local_14;
  }
  return;
}

Assistant:

void ImGui::NewLine()
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;

    ImGuiContext& g = *GImGui;
    const ImGuiLayoutType backup_layout_type = window->DC.LayoutType;
    window->DC.LayoutType = ImGuiLayoutType_Vertical;
    if (window->DC.CurrentLineSize.y > 0.0f)     // In the event that we are on a line with items that is smaller that FontSize high, we will preserve its height.
        ItemSize(ImVec2(0,0));
    else
        ItemSize(ImVec2(0.0f, g.FontSize));
    window->DC.LayoutType = backup_layout_type;
}